

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O3

PropertyBase *
Protocol::MQTT::V5::
TypedProperty<(Protocol::MQTT::V5::PropertyType)18,_Protocol::MQTT::Common::DynamicString>::
allocateProp(void)

{
  PropertyBase *pPVar1;
  void *pvVar2;
  
  pPVar1 = (PropertyBase *)operator_new(0x30);
  pPVar1->type = '\x12';
  pPVar1->next = (PropertyBase *)0x0;
  pPVar1->heapAllocated = true;
  (pPVar1->super_Serializable)._vptr_Serializable = (_func_int **)&PTR_getSize_00125428;
  *(undefined ***)&pPVar1->field_0x19 = &PTR_getSize_001253d8;
  *(undefined2 *)((long)&pPVar1[1].super_Serializable._vptr_Serializable + 1) = 0;
  pvVar2 = malloc(0);
  *(void **)((long)&pPVar1[1].super_Serializable._vptr_Serializable + 3) = pvVar2;
  return pPVar1;
}

Assistant:

static PropertyBase * allocateProp() { return new Property<T>(type, T(), true) ; }